

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlmodelserialiser.cpp
# Opt level: O0

bool __thiscall
HtmlModelSerialiserPrivate::writeHtml(HtmlModelSerialiserPrivate *this,QXmlStreamWriter *writer)

{
  qsizetype *this_00;
  QXmlStreamWriter *pQVar1;
  bool bVar2;
  byte bVar3;
  QModelIndex local_458;
  QArrayDataPointer<char16_t> local_440;
  QString local_428;
  QArrayDataPointer<char16_t> local_410;
  QString local_3f8;
  QArrayDataPointer<char16_t> local_3e0;
  QString local_3c8;
  QArrayDataPointer<char16_t> local_3b0;
  QString local_398;
  QArrayDataPointer<char16_t> local_380;
  QString local_368;
  QArrayDataPointer<char16_t> local_350;
  QString local_338;
  byte local_319;
  QArrayDataPointer<char16_t> local_318;
  QString local_300;
  undefined1 local_2e8 [8];
  QString modelName;
  QString local_2b8;
  QArrayDataPointer<char16_t> local_2a0;
  QString local_288;
  QArrayDataPointer<char16_t> local_270;
  QString local_258;
  QArrayDataPointer<char16_t> local_240;
  QString local_228;
  QArrayDataPointer<char16_t> local_210;
  QString local_1f8;
  QArrayDataPointer<char16_t> local_1e0;
  QString local_1c8;
  QArrayDataPointer<char16_t> local_1a0;
  QString local_188;
  QXmlStreamWriter *local_170;
  QXmlStreamWriter *writer_local;
  HtmlModelSerialiserPrivate *this_local;
  char16_t *local_158;
  char16_t *str_8;
  QArrayDataPointer<char16_t> *local_148;
  char16_t *local_140;
  char16_t *str_7;
  QArrayDataPointer<char16_t> *local_130;
  char16_t *local_128;
  char16_t *str_6;
  qsizetype *local_118;
  char16_t *local_110;
  char16_t *str_5;
  QArrayDataPointer<char16_t> *local_100;
  char16_t *local_f8;
  char16_t *str_11;
  QArrayDataPointer<char16_t> *local_e8;
  char16_t *local_e0;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_d0;
  char16_t *local_c8;
  char16_t *str_10;
  QArrayDataPointer<char16_t> *local_b8;
  char16_t *local_b0;
  char16_t *str_3;
  QArrayDataPointer<char16_t> *local_a0;
  char16_t *local_98;
  char16_t *str_2;
  QArrayDataPointer<char16_t> *local_88;
  char16_t *local_80;
  char16_t *str_1;
  QArrayDataPointer<char16_t> *local_70;
  char16_t *local_68;
  char16_t *str_4;
  QArrayDataPointer<char16_t> *local_58;
  char16_t *local_50;
  char16_t *str_9;
  QArrayDataPointer<char16_t> *local_40;
  char16_t *local_38;
  char16_t *str_12;
  QArrayDataPointer<char16_t> *local_28;
  char16_t *local_20;
  char16_t *str_13;
  QArrayDataPointer<char16_t> *local_10;
  
  if ((this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
      m_constModel == (QAbstractItemModel *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_170 = writer;
    writer_local = (QXmlStreamWriter *)this;
    if ((this->m_printStartDocument & 1U) != 0) {
      str = L"<!DOCTYPE html>";
      local_e0 = L"<!DOCTYPE html>";
      local_d0 = &local_1a0;
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_1a0,(Data *)0x0,L"<!DOCTYPE html>",0xf);
      QString::QString(&local_188,&local_1a0);
      QXmlStreamWriter::writeDTD((QString *)writer);
      QString::~QString(&local_188);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a0);
      pQVar1 = local_170;
      str_1 = L"html";
      local_80 = L"html";
      local_70 = &local_1e0;
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_1e0,(Data *)0x0,L"html",4);
      QString::QString(&local_1c8,&local_1e0);
      QXmlStreamWriter::writeStartElement((QString *)pQVar1);
      QString::~QString(&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e0);
      pQVar1 = local_170;
      str_2 = L"head";
      local_98 = L"head";
      local_88 = &local_210;
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_210,(Data *)0x0,L"head",4);
      QString::QString(&local_1f8,&local_210);
      QXmlStreamWriter::writeStartElement((QString *)pQVar1);
      QString::~QString(&local_1f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_210);
      pQVar1 = local_170;
      str_3 = L"meta";
      local_b0 = L"meta";
      local_a0 = &local_240;
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_240,(Data *)0x0,L"meta",4);
      QString::QString(&local_228,&local_240);
      QXmlStreamWriter::writeEmptyElement((QString *)pQVar1);
      QString::~QString(&local_228);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_240);
      pQVar1 = local_170;
      str_4 = L"charset";
      local_68 = L"charset";
      local_58 = &local_270;
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_270,(Data *)0x0,L"charset",7);
      QString::QString(&local_258,&local_270);
      local_100 = &local_2a0;
      str_5 = L"UTF-8";
      local_110 = L"UTF-8";
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_2a0,(Data *)0x0,L"UTF-8",5);
      QString::QString(&local_288,&local_2a0);
      QXmlStreamWriter::writeAttribute((QString *)pQVar1,(QString *)&local_258);
      QString::~QString(&local_288);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2a0);
      QString::~QString(&local_258);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_270);
      pQVar1 = local_170;
      this_00 = &modelName.d.size;
      str_6 = L"title";
      local_128 = L"title";
      local_118 = this_00;
      QArrayDataPointer<char16_t>::QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)this_00,(Data *)0x0,L"title",5);
      QString::QString(&local_2b8,(DataPointer *)this_00);
      QXmlStreamWriter::writeStartElement((QString *)pQVar1);
      QString::~QString(&local_2b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&modelName.d.size);
      QObject::objectName();
      pQVar1 = local_170;
      local_319 = 0;
      bVar2 = QString::isEmpty((QString *)local_2e8);
      if (bVar2) {
        local_130 = &local_318;
        str_7 = L"Model";
        local_140 = L"Model";
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_318,(Data *)0x0,L"Model",5);
        local_319 = 1;
        QString::QString(&local_300,&local_318);
      }
      else {
        QString::QString(&local_300,(QString *)local_2e8);
      }
      QXmlStreamWriter::writeCharacters((QString *)pQVar1);
      QString::~QString(&local_300);
      if ((local_319 & 1) != 0) {
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_318);
      }
      QXmlStreamWriter::writeEndElement();
      pQVar1 = local_170;
      local_148 = &local_350;
      str_8 = L"style";
      local_158 = L"style";
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_350,(Data *)0x0,L"style",5);
      QString::QString(&local_338,&local_350);
      QXmlStreamWriter::writeStartElement((QString *)pQVar1);
      QString::~QString(&local_338);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_350);
      pQVar1 = local_170;
      local_40 = &local_380;
      str_9 = 
      L"table, th, td { border: 1px solid black; } table { border-collapse: collapse; width: 100%; }"
      ;
      local_50 = 
      L"table, th, td { border: 1px solid black; } table { border-collapse: collapse; width: 100%; }"
      ;
      QArrayDataPointer<char16_t>::QArrayDataPointer
                (&local_380,(Data *)0x0,
                 L"table, th, td { border: 1px solid black; } table { border-collapse: collapse; width: 100%; }"
                 ,0x5c);
      QString::QString(&local_368,&local_380);
      QXmlStreamWriter::writeCharacters((QString *)pQVar1);
      QString::~QString(&local_368);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_380);
      QXmlStreamWriter::writeEndElement();
      QXmlStreamWriter::writeEndElement();
      pQVar1 = local_170;
      local_b8 = &local_3b0;
      str_10 = L"body";
      local_c8 = L"body";
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_3b0,(Data *)0x0,L"body",4);
      QString::QString(&local_398,&local_3b0);
      QXmlStreamWriter::writeStartElement((QString *)pQVar1);
      QString::~QString(&local_398);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3b0);
      QString::~QString((QString *)local_2e8);
    }
    pQVar1 = local_170;
    str_11 = L"div";
    local_f8 = L"div";
    local_e8 = &local_3e0;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_3e0,(Data *)0x0,L"div",3);
    QString::QString(&local_3c8,&local_3e0);
    QXmlStreamWriter::writeStartElement((QString *)pQVar1);
    QString::~QString(&local_3c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3e0);
    pQVar1 = local_170;
    str_12 = L"data-modelcode";
    local_38 = L"data-modelcode";
    local_28 = &local_410;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_410,(Data *)0x0,L"data-modelcode",0xe);
    QString::QString(&local_3f8,&local_410);
    local_10 = &local_440;
    str_13 = L"808FC674-78A0-4682-9C17-E05B18A0CDD3";
    local_20 = L"808FC674-78A0-4682-9C17-E05B18A0CDD3";
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&local_440,(Data *)0x0,L"808FC674-78A0-4682-9C17-E05B18A0CDD3",0x24);
    QString::QString(&local_428,&local_440);
    QXmlStreamWriter::writeAttribute((QString *)pQVar1,(QString *)&local_3f8);
    QString::~QString(&local_428);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_440);
    QString::~QString(&local_3f8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_410);
    pQVar1 = local_170;
    QModelIndex::QModelIndex(&local_458);
    writeHtmlElement(this,pQVar1,&local_458);
    QXmlStreamWriter::writeEndElement();
    if ((this->m_printStartDocument & 1U) != 0) {
      QXmlStreamWriter::writeEndElement();
      QXmlStreamWriter::writeEndElement();
    }
    bVar3 = QXmlStreamWriter::hasError();
    this_local._7_1_ = (bool)((bVar3 ^ 0xff) & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool HtmlModelSerialiserPrivate::writeHtml(QXmlStreamWriter &writer) const
{
    if (!m_constModel)
        return false;
    if (m_printStartDocument) {
        writer.writeDTD(QStringLiteral("<!DOCTYPE html>"));
        writer.writeStartElement(QStringLiteral("html"));
        writer.writeStartElement(QStringLiteral("head"));
        writer.writeEmptyElement(QStringLiteral("meta"));
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
        writer.writeAttribute(QStringLiteral("charset"), QString::fromLatin1(writer.codec()->name()));
#else
        writer.writeAttribute(QStringLiteral("charset"), QStringLiteral("UTF-8"));
#endif
        writer.writeStartElement(QStringLiteral("title"));
        const QString modelName = m_constModel->objectName();
        writer.writeCharacters(modelName.isEmpty() ? QStringLiteral("Model") : modelName);
        writer.writeEndElement(); // title
        writer.writeStartElement(QStringLiteral("style"));
        writer.writeCharacters(QStringLiteral("table, th, td { border: 1px solid black; } table { border-collapse: collapse; width: 100%; }"));
        writer.writeEndElement(); // style
        writer.writeEndElement(); // head
        writer.writeStartElement(QStringLiteral("body"));
    }
    writer.writeStartElement(QStringLiteral("div"));
    writer.writeAttribute(QStringLiteral("data-modelcode"), Magic_Model_Header);
    writeHtmlElement(writer);
    writer.writeEndElement(); // div
    if (m_printStartDocument) {
        writer.writeEndElement(); // body
        writer.writeEndElement(); // html
    }
    return !writer.hasError();
}